

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::ConstantPaddingLayerParams
          (ConstantPaddingLayerParams *this,ConstantPaddingLayerParams *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ConstantPaddingLayerParams_003d7088;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->padamounts_).current_size_ = 0;
  (this->padamounts_).total_size_ = 0;
  (this->padamounts_).rep_ = (Rep *)0x0;
  new_size = (from->padamounts_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->padamounts_,new_size);
    memcpy(((this->padamounts_).rep_)->elements,((from->padamounts_).rep_)->elements,
           (long)(from->padamounts_).current_size_ << 3);
    (this->padamounts_).current_size_ = (from->padamounts_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->padtogivenoutputsizemode_ = from->padtogivenoutputsizemode_;
  this->value_ = from->value_;
  return;
}

Assistant:

ConstantPaddingLayerParams::ConstantPaddingLayerParams(const ConstantPaddingLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      padamounts_(from.padamounts_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&value_, &from.value_,
    reinterpret_cast<char*>(&padtogivenoutputsizemode_) -
    reinterpret_cast<char*>(&value_) + sizeof(padtogivenoutputsizemode_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ConstantPaddingLayerParams)
}